

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::
ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderThreadAllIntraTestLarge>::RegisterTests
          (ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderThreadAllIntraTestLarge>
           *this)

{
  TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>_>
  *pTVar1;
  _Alloc_hider test_suite_name_00;
  _Alloc_hider name;
  _Alloc_hider value_param;
  bool bVar2;
  int iVar3;
  int iVar4;
  pointer __lhs;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 *puVar5;
  ostream *poVar6;
  size_type sVar7;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  pointer psVar9;
  tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int> *value;
  size_type index;
  ulong uVar10;
  bool bVar11;
  GTestLog local_1c0;
  int local_1bc;
  _Head_base<0UL,_testing::internal::ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>_>_*,_false>
  local_1b8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1b0;
  char *local_1a8;
  shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderThreadAllIntraTestLarge>::TestInfo>
  test_info;
  long local_190;
  string param_name;
  ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>_>
  generator;
  string test_suite_name;
  string local_138;
  long local_118;
  pointer local_110;
  pointer local_108;
  ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderThreadAllIntraTestLarge> *local_100;
  code *local_f8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  string local_c0;
  CodeLocation local_a0;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  CodeLocation local_58;
  undefined4 *puVar8;
  undefined4 extraout_var_01;
  
  psVar9 = (this->tests_).
           super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderThreadAllIntraTestLarge>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderThreadAllIntraTestLarge>::TestInfo>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar11 = false;
  local_100 = this;
  do {
    if (psVar9 == (this->tests_).
                  super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderThreadAllIntraTestLarge>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderThreadAllIntraTestLarge>::TestInfo>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      if (!bVar11) {
        iVar3 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase
                  [2])(this);
        CodeLocation::CodeLocation(&local_58,&this->code_location_);
        InsertSyntheticTestCase
                  ((string *)CONCAT44(extraout_var_06,iVar3),&local_58,
                   (this->tests_).
                   super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderThreadAllIntraTestLarge>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderThreadAllIntraTestLarge>::TestInfo>_>_>
                   ._M_impl.super__Vector_impl_data._M_start !=
                   (this->tests_).
                   super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderThreadAllIntraTestLarge>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderThreadAllIntraTestLarge>::TestInfo>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        std::__cxx11::string::~string((string *)&local_58);
      }
      return;
    }
    test_info.
    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderThreadAllIntraTestLarge>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (psVar9->
              super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderThreadAllIntraTestLarge>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr;
    local_110 = psVar9;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count
              (&test_info.
                super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderThreadAllIntraTestLarge>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,
               &(psVar9->
                super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderThreadAllIntraTestLarge>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                )._M_refcount);
    __lhs = (this->instantiations_).
            super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderThreadAllIntraTestLarge>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderThreadAllIntraTestLarge>::InstantiationInfo>_>
            ._M_impl.super__Vector_impl_data._M_start;
    while (__lhs != (this->instantiations_).
                    super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderThreadAllIntraTestLarge>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderThreadAllIntraTestLarge>::InstantiationInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
      (*(code *)__lhs->generator)(&generator);
      local_f8 = (code *)__lhs->name_func;
      local_1a8 = __lhs->file;
      local_1bc = __lhs->line;
      test_suite_name._M_dataplus._M_p = (pointer)&test_suite_name.field_2;
      test_suite_name._M_string_length = 0;
      test_suite_name.field_2._M_local_buf[0] = '\0';
      if ((__lhs->name)._M_string_length != 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &test_param_names,&__lhs->name,"/");
        std::__cxx11::string::operator=((string *)&test_suite_name,(string *)&test_param_names);
        std::__cxx11::string::~string((string *)&test_param_names);
      }
      local_108 = __lhs;
      std::__cxx11::string::append((string *)&test_suite_name);
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &test_param_names._M_t._M_impl.super__Rb_tree_header._M_header;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      iVar3 = (*(generator.impl_.
                 super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->_vptr_ParamGeneratorInterface[2])();
      local_1b8._M_head_impl =
           (ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>_>
            *)CONCAT44(extraout_var,iVar3);
      local_190 = 0;
      while( true ) {
        iVar3 = (*(generator.impl_.
                   super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->_vptr_ParamGeneratorInterface[3])();
        local_138._M_dataplus._M_p = (pointer)CONCAT44(extraout_var_00,iVar3);
        bVar2 = ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>_>
                ::operator!=((ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>_>
                              *)&local_1b8,
                             (ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>_>
                              *)&local_138);
        if ((long *)local_138._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_138._M_dataplus._M_p + 8))();
        }
        if (!bVar2) break;
        Message::Message((Message *)&local_1b0);
        iVar3 = (*(local_1b8._M_head_impl)->_vptr_ParamIteratorInterface[5])();
        puVar5 = (undefined8 *)CONCAT44(extraout_var_01,iVar3);
        local_138._M_dataplus._M_p = (pointer)*puVar5;
        local_138._M_string_length._0_4_ = *(undefined4 *)(puVar5 + 1);
        local_138._M_string_length._4_4_ = *(undefined4 *)((long)puVar5 + 0xc);
        local_138.field_2._M_allocated_capacity._0_4_ = *(undefined4 *)(puVar5 + 2);
        local_138.field_2._M_allocated_capacity._4_4_ = *(undefined4 *)((long)puVar5 + 0x14);
        local_138.field_2._8_4_ = *(undefined4 *)(puVar5 + 3);
        local_138.field_2._12_4_ = *(undefined4 *)((long)puVar5 + 0x1c);
        local_118 = local_190;
        (*local_f8)(&param_name,&local_138);
        if (param_name._M_string_length == 0) {
          bVar11 = false;
        }
        else {
          for (uVar10 = 0; bVar11 = param_name._M_string_length <= uVar10, !bVar11;
              uVar10 = uVar10 + 1) {
            bVar2 = IsAlNum(param_name._M_dataplus._M_p[uVar10]);
            if ((!bVar2) && (param_name._M_dataplus._M_p[uVar10] != '_')) break;
          }
        }
        bVar11 = IsTrue(bVar11);
        if (!bVar11) {
          GTestLog::GTestLog((GTestLog *)&local_138,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-param-util.h"
                             ,0x246);
          poVar6 = std::operator<<((ostream *)&std::cerr,
                                   "Condition IsValidParamName(param_name) failed. ");
          poVar6 = std::operator<<(poVar6,"Parameterized test name \'");
          poVar6 = std::operator<<(poVar6,(string *)&param_name);
          poVar6 = std::operator<<(poVar6,"\' is invalid, in ");
          poVar6 = std::operator<<(poVar6,local_1a8);
          poVar6 = std::operator<<(poVar6," line ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_1bc);
          std::endl<char,std::char_traits<char>>(poVar6);
          GTestLog::~GTestLog((GTestLog *)&local_138);
        }
        sVar7 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&test_param_names,&param_name);
        bVar11 = IsTrue(sVar7 == 0);
        if (!bVar11) {
          GTestLog::GTestLog((GTestLog *)&local_138,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-param-util.h"
                             ,0x24a);
          poVar6 = std::operator<<((ostream *)&std::cerr,
                                   "Condition test_param_names.count(param_name) == 0 failed. ");
          poVar6 = std::operator<<(poVar6,"Duplicate parameterized test name \'");
          poVar6 = std::operator<<(poVar6,(string *)&param_name);
          poVar6 = std::operator<<(poVar6,"\', in ");
          poVar6 = std::operator<<(poVar6,local_1a8);
          poVar6 = std::operator<<(poVar6," line ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_1bc);
          std::endl<char,std::char_traits<char>>(poVar6);
          GTestLog::~GTestLog((GTestLog *)&local_138);
        }
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&test_param_names,&param_name);
        if (((test_info.
              super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderThreadAllIntraTestLarge>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->test_base_name)._M_string_length != 0) {
          std::operator<<((ostream *)(local_1b0._M_head_impl + 0x10),
                          (string *)
                          &(test_info.
                            super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderThreadAllIntraTestLarge>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->test_base_name);
          std::operator<<((ostream *)(local_1b0._M_head_impl + 0x10),"/");
        }
        std::operator<<((ostream *)(local_1b0._M_head_impl + 0x10),(string *)&param_name);
        test_suite_name_00 = test_suite_name._M_dataplus;
        Message::GetString_abi_cxx11_(&local_138,(Message *)&local_1b0);
        name._M_p = local_138._M_dataplus._M_p;
        iVar3 = (*(local_1b8._M_head_impl)->_vptr_ParamIteratorInterface[5])();
        PrintToString<std::tuple<libaom_test::CodecFactory_const*,libaom_test::TestMode,int,int,int,int>>
                  (&local_c0,(testing *)CONCAT44(extraout_var_02,iVar3),value);
        value_param._M_p = local_c0._M_dataplus._M_p;
        CodeLocation::CodeLocation
                  (&local_a0,
                   &(test_info.
                     super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderThreadAllIntraTestLarge>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->code_location);
        iVar3 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase
                  [3])(this);
        bVar11 = IsTrue(true);
        if (!bVar11) {
          GTestLog::GTestLog(&local_1c0,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-internal.h"
                             ,0x20e);
          poVar6 = std::operator<<((ostream *)&std::cerr,
                                   "Condition !test_case_fp || !test_suite_fp failed. ");
          poVar6 = std::operator<<(poVar6,
                                   "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                                  );
          poVar6 = std::operator<<(poVar6,local_1a8);
          poVar6 = std::operator<<(poVar6,":");
          std::ostream::operator<<(poVar6,local_1bc);
          GTestLog::~GTestLog(&local_1c0);
        }
        bVar11 = IsTrue(true);
        if (!bVar11) {
          GTestLog::GTestLog(&local_1c0,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-internal.h"
                             ,0x223);
          poVar6 = std::operator<<((ostream *)&std::cerr,
                                   "Condition !test_case_fp || !test_suite_fp failed. ");
          poVar6 = std::operator<<(poVar6,
                                   "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                                  );
          poVar6 = std::operator<<(poVar6,local_1a8);
          poVar6 = std::operator<<(poVar6,":");
          std::ostream::operator<<(poVar6,local_1bc);
          GTestLog::~GTestLog(&local_1c0);
        }
        pTVar1 = ((test_info.
                   super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderThreadAllIntraTestLarge>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->test_meta_factory)._M_t.
                 super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>_>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>_>_>_>
                 .
                 super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>_>_*,_false>
                 ._M_head_impl;
        iVar4 = (*(local_1b8._M_head_impl)->_vptr_ParamIteratorInterface[5])();
        puVar8 = (undefined4 *)CONCAT44(extraout_var_04,iVar4);
        local_78 = *puVar8;
        uStack_74 = puVar8[1];
        uStack_70 = puVar8[2];
        uStack_6c = puVar8[3];
        local_68 = puVar8[4];
        uStack_64 = puVar8[5];
        uStack_60 = puVar8[6];
        uStack_5c = puVar8[7];
        iVar4 = (*pTVar1->_vptr_TestMetaFactoryBase[2])(pTVar1,&local_78);
        MakeAndRegisterTestInfo
                  (test_suite_name_00._M_p,name._M_p,(char *)0x0,value_param._M_p,&local_a0,
                   (TypeId)CONCAT44(extraout_var_03,iVar3),(SetUpTestSuiteFunc)0x0,
                   (TearDownTestSuiteFunc)0x0,(TestFactoryBase *)CONCAT44(extraout_var_05,iVar4));
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_138);
        std::__cxx11::string::~string((string *)&param_name);
        if (local_1b0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_1b0._M_head_impl + 8))();
        }
        (*(local_1b8._M_head_impl)->_vptr_ParamIteratorInterface[3])();
        local_190 = local_190 + 1;
        bVar11 = true;
        this = local_100;
      }
      if (local_1b8._M_head_impl !=
          (ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>_>
           *)0x0) {
        (*(local_1b8._M_head_impl)->_vptr_ParamIteratorInterface[1])();
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&test_param_names);
      std::__cxx11::string::~string((string *)&test_suite_name);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&generator.impl_.
                  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      __lhs = local_108 + 1;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&test_info.
                super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderThreadAllIntraTestLarge>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    psVar9 = local_110 + 1;
  } while( true );
}

Assistant:

void RegisterTests() override {
    bool generated_instantiations = false;

    for (typename TestInfoContainer::iterator test_it = tests_.begin();
         test_it != tests_.end(); ++test_it) {
      std::shared_ptr<TestInfo> test_info = *test_it;
      for (typename InstantiationContainer::iterator gen_it =
               instantiations_.begin();
           gen_it != instantiations_.end(); ++gen_it) {
        const std::string& instantiation_name = gen_it->name;
        ParamGenerator<ParamType> generator((*gen_it->generator)());
        ParamNameGeneratorFunc* name_func = gen_it->name_func;
        const char* file = gen_it->file;
        int line = gen_it->line;

        std::string test_suite_name;
        if (!instantiation_name.empty())
          test_suite_name = instantiation_name + "/";
        test_suite_name += test_info->test_suite_base_name;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (typename ParamGenerator<ParamType>::iterator param_it =
                 generator.begin();
             param_it != generator.end(); ++param_it, ++i) {
          generated_instantiations = true;

          Message test_name_stream;

          std::string param_name =
              name_func(TestParamInfo<ParamType>(*param_it, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid, in " << file << " line " << line << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name << "', in "
              << file << " line " << line << std::endl;

          test_param_names.insert(param_name);

          if (!test_info->test_base_name.empty()) {
            test_name_stream << test_info->test_base_name << "/";
          }
          test_name_stream << param_name;
          MakeAndRegisterTestInfo(
              test_suite_name.c_str(), test_name_stream.GetString().c_str(),
              nullptr,  // No type parameter.
              PrintToString(*param_it).c_str(), test_info->code_location,
              GetTestSuiteTypeId(),
              SuiteApiResolver<TestSuite>::GetSetUpCaseOrSuite(file, line),
              SuiteApiResolver<TestSuite>::GetTearDownCaseOrSuite(file, line),
              test_info->test_meta_factory->CreateTestFactory(*param_it));
        }  // for param_it
      }    // for gen_it
    }      // for test_it

    if (!generated_instantiations) {
      // There are no generaotrs, or they all generate nothing ...
      InsertSyntheticTestCase(GetTestSuiteName(), code_location_,
                              !tests_.empty());
    }
  }